

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagTypes.cpp
# Opt level: O0

JtagShiftedData * __thiscall
JtagShiftedData::GetASCIIString_abi_cxx11_
          (JtagShiftedData *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *bits)

{
  bool bVar1;
  difference_type dVar2;
  ulong uVar3;
  reference puVar4;
  undefined1 local_f8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  char local_98 [8];
  char number_str [32];
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_68;
  const_iterator bsi;
  U64 val;
  BitState local_3c;
  uchar *local_38;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  const_iterator srch_hi;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bits_local;
  string *ret_val;
  
  srch_hi._M_current._7_1_ = 0;
  std::__cxx11::string::string((string *)this);
  local_30._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(bits);
  local_38 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(bits);
  local_3c = BIT_HIGH;
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,BitState>
                       (local_30,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  )local_38,&local_3c);
  val = (U64)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(bits);
  dVar2 = __gnu_cxx::operator-
                    ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&val,&local_28);
  if (dVar2 < 9) {
    local_70._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(bits);
    local_68 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator-(&local_70,8);
    bsi._M_current = (uchar *)0x0;
    while( true ) {
      number_str._24_8_ = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(bits);
      bVar1 = __gnu_cxx::operator!=
                        (&local_68,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)(number_str + 0x18));
      if (!bVar1) break;
      uVar3 = (long)bsi._M_current << 1;
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_68);
      bsi._M_current = (uchar *)(uVar3 | (long)(int)(uint)(*puVar4 == '\x01'));
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&local_68);
    }
    AnalyzerHelpers::GetNumberString((ulonglong)bsi._M_current,ASCII,8,local_98,0x20);
    std::__cxx11::string::operator=((string *)this,local_98);
  }
  else {
    GetDecimalString_abi_cxx11_((JtagShiftedData *)local_f8,bits);
    std::operator+((char)local_f8 + ' ',
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27);
    std::operator+(local_b8,(char)local_f8 + ' ');
    std::__cxx11::string::operator=((string *)this,(string *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)(local_f8 + 0x20));
    std::__cxx11::string::~string((string *)local_f8);
  }
  return this;
}

Assistant:

std::string JtagShiftedData::GetASCIIString( const std::vector<U8>& bits )
{
    std::string ret_val;

    // Check if the value of the number represented by bits is less than 0x100.
    // If it is, we can make an ASCII out of it, otherwise use GetDecimalString()
    std::vector<U8>::const_iterator srch_hi( std::find( bits.begin(), bits.end(), BIT_HIGH ) );
    if( bits.end() - srch_hi <= 8 )
    {
        // Get the numerical value from the bits.
        U64 val;

        // Only get the 8 least significant bits
        std::vector<U8>::const_iterator bsi( bits.end() - 8 );
        for( val = 0; bsi != bits.end(); ++bsi )
            val = ( val << 1 ) | ( *bsi == BIT_HIGH ? 1 : 0 );

        // make a string out of that value
        char number_str[ 32 ];
        AnalyzerHelpers::GetNumberString( val, ASCII, 8, number_str, sizeof( number_str ) );

        ret_val = number_str;
    }
    else
    {
        ret_val = '\'' + GetDecimalString( bits ) + '\'';
    }

    return ret_val;
}